

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall lzham::symbol_codec::arith_stop_encoding(symbol_codec *this)

{
  uint *puVar1;
  uchar *puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  bVar7 = 0x2000000 < this->m_arith_length;
  uVar6 = 0x8000;
  if (bVar7) {
    uVar6 = 0x800000;
  }
  uVar4 = (uint)bVar7 * 0x800000 + 0x800000;
  puVar1 = &this->m_arith_base;
  uVar5 = *puVar1;
  *puVar1 = *puVar1 + uVar4;
  this->m_arith_length = uVar6;
  if (CARRY4(uVar5,uVar4)) {
    uVar5 = (this->m_arith_output_buf).m_size;
    while (uVar5 = uVar5 - 1, -1 < (int)uVar5) {
      puVar2 = (this->m_arith_output_buf).m_p;
      if (puVar2[uVar5] != 0xff) {
        puVar2[uVar5] = puVar2[uVar5] + '\x01';
        break;
      }
      puVar2[uVar5] = '\0';
    }
  }
  bVar7 = arith_renorm_enc_interval(this);
  if (bVar7) {
    uVar5 = (this->m_arith_output_buf).m_size;
    bVar7 = true;
    if (uVar5 < 4) {
      do {
        if (((this->m_arith_output_buf).m_capacity <= uVar5) &&
           (bVar3 = elemental_vector::increase_capacity
                              ((elemental_vector *)&this->m_arith_output_buf,uVar5 + 1,true,1,
                               (object_mover)0x0,true), !bVar3)) goto LAB_0011f2f4;
        (this->m_arith_output_buf).m_p[(this->m_arith_output_buf).m_size] = '\0';
        uVar5 = (this->m_arith_output_buf).m_size + 1;
        (this->m_arith_output_buf).m_size = uVar5;
        this->m_total_bits_written = this->m_total_bits_written + 8;
      } while (uVar5 < 4);
    }
  }
  else {
LAB_0011f2f4:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool symbol_codec::arith_stop_encoding()
   {
      uint orig_base = m_arith_base;

      if (m_arith_length > 2 * cSymbolCodecArithMinLen)
      {
         m_arith_base  += cSymbolCodecArithMinLen;
         m_arith_length = (cSymbolCodecArithMinLen >> 1);
      }
      else
      {
         m_arith_base  += (cSymbolCodecArithMinLen >> 1);
         m_arith_length = (cSymbolCodecArithMinLen >> 9);
      }

      if (orig_base > m_arith_base)
         arith_propagate_carry();

      if (!arith_renorm_enc_interval())
         return false;

      while (m_arith_output_buf.size() < 4)
      {
         if (!m_arith_output_buf.try_push_back(0))
            return false;
         m_total_bits_written += 8;
      }
      return true;
   }